

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByCamelcaseName(Descriptor *this,string_view camelcase_name)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  FieldDescriptor *result;
  Descriptor *this_local;
  string_view camelcase_name_local;
  
  pFVar2 = file(this);
  camelcase_name_local._M_str =
       (char *)FileDescriptorTables::FindFieldByCamelcaseName(pFVar2->tables_,this,camelcase_name);
  if (((FieldDescriptor *)camelcase_name_local._M_str == (FieldDescriptor *)0x0) ||
     (bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)camelcase_name_local._M_str), bVar1))
  {
    camelcase_name_local._M_str = (char *)0x0;
  }
  return (FieldDescriptor *)camelcase_name_local._M_str;
}

Assistant:

const FieldDescriptor* Descriptor::FindFieldByCamelcaseName(
    absl::string_view camelcase_name) const {
  const FieldDescriptor* result =
      file()->tables_->FindFieldByCamelcaseName(this, camelcase_name);
  if (result == nullptr || result->is_extension()) {
    return nullptr;
  } else {
    return result;
  }
}